

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O0

void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *p,int iGrp1,int iGrp2)

{
  int local_1c;
  int iVar;
  int iGrp2_local;
  int iGrp1_local;
  Llb_Mtr_t *p_local;
  
  if ((iGrp1 < 1) || (p->nCols + -1 <= iGrp1)) {
    __assert_fail("iGrp1 >= 1 && iGrp1 < p->nCols - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                  ,0xe3,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  if ((0 < iGrp2) && (iGrp2 < p->nCols + -1)) {
    if (p->pColGrps[iGrp1] == (Llb_Grp_t *)0x0) {
      __assert_fail("p->pColGrps[iGrp1] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                    ,0xe5,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
    }
    if (p->pColGrps[iGrp2] != (Llb_Grp_t *)0x0) {
      for (local_1c = 0; local_1c < p->nRows; local_1c = local_1c + 1) {
        if ((p->pMatrix[iGrp1][local_1c] == '\x01') && (p->pMatrix[iGrp2][local_1c] == '\x01')) {
          p->pRowSums[local_1c] = p->pRowSums[local_1c] + -1;
        }
        if ((p->pMatrix[iGrp1][local_1c] == '\0') && (p->pMatrix[iGrp2][local_1c] == '\x01')) {
          p->pMatrix[iGrp1][local_1c] = '\x01';
          p->pColSums[iGrp1] = p->pColSums[iGrp1] + 1;
        }
        if (p->pMatrix[iGrp2][local_1c] == '\x01') {
          p->pMatrix[iGrp2][local_1c] = '\0';
        }
      }
      p->pColSums[iGrp2] = 0;
      return;
    }
    __assert_fail("p->pColGrps[iGrp2] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                  ,0xe6,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  __assert_fail("iGrp2 >= 1 && iGrp2 < p->nCols - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                ,0xe4,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
}

Assistant:

void Llb_MtrCombineSelectedColumns( Llb_Mtr_t * p, int iGrp1, int iGrp2 )
{
    int iVar;
    assert( iGrp1 >= 1 && iGrp1 < p->nCols - 1 );
    assert( iGrp2 >= 1 && iGrp2 < p->nCols - 1 );
    assert( p->pColGrps[iGrp1] != NULL );
    assert( p->pColGrps[iGrp2] != NULL );
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pMatrix[iGrp1][iVar] == 1 && p->pMatrix[iGrp2][iVar] == 1 )
            p->pRowSums[iVar]--;
        if ( p->pMatrix[iGrp1][iVar] == 0 && p->pMatrix[iGrp2][iVar] == 1 )
        {
            p->pMatrix[iGrp1][iVar] = 1;
            p->pColSums[iGrp1]++;
        }
        if ( p->pMatrix[iGrp2][iVar] == 1 )
            p->pMatrix[iGrp2][iVar] = 0;
    }
    p->pColSums[iGrp2] = 0;
}